

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.hpp
# Opt level: O0

void __thiscall boost::deflate::detail::inflate_stream::inflate_stream(inflate_stream *this)

{
  code *pcVar1;
  inflate_stream *this_local;
  
  bitstream::bitstream(&this->bi_);
  this->mode_ = HEAD;
  this->last_ = 0;
  this->havedict_ = false;
  this->dmax_ = 0x8000;
  this->head_ = (gz_header *)0x0;
  window::window(&this->w_);
  pcVar1 = this->codes_;
  this->next_ = pcVar1;
  this->back_ = -1;
  this->lencode_ = pcVar1;
  this->distcode_ = pcVar1;
  window::reset(&this->w_,0xf);
  return;
}

Assistant:

inflate_stream()
    {
        w_.reset(15);
    }